

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbopl.cpp
# Opt level: O2

void __thiscall DBOPL::Operator::UpdateFrequency(Operator *this)

{
  Bit32u BVar1;
  uint uVar2;
  byte bVar3;
  
  uVar2 = this->chanData & 0x3ff;
  bVar3 = (byte)(this->chanData >> 10);
  this->waveAdd = (uVar2 << (bVar3 & 0x1f)) * this->freqMul;
  uVar2 = uVar2 >> 7;
  BVar1 = 0;
  if ((this->reg20 & 0x40) != 0) {
    BVar1 = (uVar2 << (bVar3 & 0x1f)) * this->freqMul;
  }
  this->vibStrength = (byte)uVar2 & (char)(this->reg20 * '\x02') >> 7;
  this->vibrato = BVar1;
  return;
}

Assistant:

void Operator::UpdateFrequency(  ) {
	Bit32u freq = chanData & (( 1 << 10 ) - 1);
	Bit32u block = (chanData >> 10) & 0xff;
#ifdef WAVE_PRECISION
	block = 7 - block;
	waveAdd = ( freq * freqMul ) >> block;
#else
	waveAdd = ( freq << block ) * freqMul;
#endif
	if ( reg20 & MASK_VIBRATO ) {
		vibStrength = (Bit8u)(freq >> 7);

#ifdef WAVE_PRECISION
		vibrato = ( vibStrength * freqMul ) >> block;
#else
		vibrato = ( vibStrength << block ) * freqMul;
#endif
	} else {
		vibStrength = 0;
		vibrato = 0;
	}
}